

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostDetailsProvider.cpp
# Opt level: O0

HostDetails * __thiscall
FIX::HostDetailsProvider::getHost
          (HostDetails *__return_storage_ptr__,HostDetailsProvider *this,SessionID *s,Dictionary *d)

{
  undefined8 uVar1;
  bool bVar2;
  __type_conflict1 _Var3;
  long lVar4;
  pointer ppVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>,_bool>
  pVar6;
  allocator<char> local_161;
  undefined1 local_160 [5];
  bool isDefinedInSettings;
  allocator<char> local_139;
  string local_138;
  int local_114;
  _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
  _Stack_110;
  int startOverInterval;
  undefined1 local_108;
  LastConnectionAttempt local_100;
  _Base_ptr local_f0;
  pair<std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>,_bool>
  result;
  time_t now;
  iterator sessionIt;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string hostSelectionPolicy;
  Dictionary *d_local;
  SessionID *s_local;
  HostDetailsProvider *this_local;
  HostDetails *details;
  
  hostSelectionPolicy.field_2._8_8_ = d;
  std::__cxx11::string::string((string *)local_48);
  uVar1 = hostSelectionPolicy.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"HostSelectionPolicy",&local_69);
  bVar2 = Dictionary::has((Dictionary *)uVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  uVar1 = hostSelectionPolicy.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"HostSelectionPolicy",
               (allocator<char> *)((long)&sessionIt._M_node + 7));
    Dictionary::getString(&local_a0,(Dictionary *)uVar1,&local_c0,false);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sessionIt._M_node + 7));
  }
  now = (time_t)std::
                map<FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>_>
                ::find(&this->m_sessionToLastConnectionAttempt,s);
  lVar4 = std::function<long_()>::operator()(&this->getTime);
  result._8_8_ = std::
                 map<FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>_>
                 ::end(&this->m_sessionToLastConnectionAttempt);
  bVar2 = std::operator==((_Self *)&now,(_Self *)&result.second);
  if (bVar2) {
    local_100.hostNumber = 0;
    local_100.time = lVar4;
    pVar6 = std::
            map<FIX::SessionID,FIX::HostDetailsProvider::LastConnectionAttempt,std::less<FIX::SessionID>,std::allocator<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>>
            ::emplace<FIX::SessionID_const&,FIX::HostDetailsProvider::LastConnectionAttempt>
                      ((map<FIX::SessionID,FIX::HostDetailsProvider::LastConnectionAttempt,std::less<FIX::SessionID>,std::allocator<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>>
                        *)&this->m_sessionToLastConnectionAttempt,s,&local_100);
    _Stack_110 = pVar6.first._M_node;
    local_108 = pVar6.second;
    local_f0 = _Stack_110._M_node;
    result.first._M_node._0_1_ = local_108;
    now = (time_t)_Stack_110._M_node;
  }
  else {
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,&HOST_SELECTION_POLICY_PRIORITY_abi_cxx11_);
    uVar1 = hostSelectionPolicy.field_2._8_8_;
    if (_Var3) {
      local_114 = 0x78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"HostSelectionPolicyPriorityStartOverInterval",&local_139);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      uVar1 = hostSelectionPolicy.field_2._8_8_;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_160,"HostSelectionPolicyPriorityStartOverInterval",&local_161);
        local_114 = Dictionary::getInt((Dictionary *)uVar1,(string *)local_160);
        std::__cxx11::string::~string((string *)local_160);
        std::allocator<char>::~allocator(&local_161);
      }
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                             *)&now);
      if (lVar4 - (ppVar5->second).time < (long)local_114) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                               *)&now);
        (ppVar5->second).hostNumber = (ppVar5->second).hostNumber + 1;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                               *)&now);
        (ppVar5->second).time = lVar4;
      }
      else {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                               *)&now);
        (ppVar5->second).hostNumber = 0;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                               *)&now);
        (ppVar5->second).time = lVar4;
      }
    }
    else {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                             *)&now);
      (ppVar5->second).hostNumber = (ppVar5->second).hostNumber + 1;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                             *)&now);
      (ppVar5->second).time = lVar4;
    }
  }
  HostDetails::HostDetails(__return_storage_ptr__);
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                         *)&now);
  bVar2 = populateHostDetails(this,(ppVar5->second).hostNumber,
                              (Dictionary *)hostSelectionPolicy.field_2._8_8_,__return_storage_ptr__
                             );
  if (!bVar2) {
    populateHostDetails(this,0,(Dictionary *)hostSelectionPolicy.field_2._8_8_,
                        __return_storage_ptr__);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>
                           *)&now);
    (ppVar5->second).hostNumber = 0;
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

FIX::HostDetails FIX::HostDetailsProvider::getHost(const SessionID &s, const Dictionary &d) {
  std::string hostSelectionPolicy;
  if (d.has(HOST_SELECTION_POLICY)) {
    hostSelectionPolicy = d.getString(HOST_SELECTION_POLICY);
  }

  auto sessionIt = m_sessionToLastConnectionAttempt.find(s);

  time_t now = getTime();

  if (sessionIt == m_sessionToLastConnectionAttempt.end()) {
    auto result = m_sessionToLastConnectionAttempt.emplace(s, LastConnectionAttempt{0, now});
    sessionIt = result.first;
  } else {
    if (hostSelectionPolicy == HOST_SELECTION_POLICY_PRIORITY) {
      int startOverInterval = 120;
      if (d.has(HOST_SELECTION_POLICY_PRIORITY_START_OVER_INTERVAL)) {
        startOverInterval = d.getInt(HOST_SELECTION_POLICY_PRIORITY_START_OVER_INTERVAL);
      }

      if ((now - sessionIt->second.time >= startOverInterval)) {
        sessionIt->second.hostNumber = 0;
        sessionIt->second.time = now;
      } else {
        ++sessionIt->second.hostNumber;
        sessionIt->second.time = now;
      }
    } else {
      ++sessionIt->second.hostNumber;
      sessionIt->second.time = now;
    }
  }

  HostDetails details;
  bool isDefinedInSettings = populateHostDetails(sessionIt->second.hostNumber, d, details);

  if (!isDefinedInSettings) {
    populateHostDetails(0, d, details);
    sessionIt->second.hostNumber = 0;
  }

  return details;
}